

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bingo.hpp
# Opt level: O1

void __thiscall BingoGenerator::init_consumable_goals(BingoGenerator *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  uint __val;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  BingoGenerator *local_38;
  
  this_00 = &this->_consumable_goals;
  local_38 = this;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[14]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (char (*) [14])"Have 9 EkeEke");
  paVar1 = &local_58.field_2;
  paVar2 = &local_98.field_2;
  paVar3 = &local_78.field_2;
  __val = 6;
  do {
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_58,1,'-');
    std::__detail::__to_chars_10_impl<unsigned_int>(local_58._M_dataplus._M_p,1,__val);
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_58,0,0,"Have ",5);
    local_98._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == paVar5) {
      local_98.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_98.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_98._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_98.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    local_98._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_98," Detox Grass");
    local_78._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == paVar5) {
      local_78.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_78.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_78._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_78.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    local_78._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               &local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar3) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_58,1,'-');
    std::__detail::__to_chars_10_impl<unsigned_int>(local_58._M_dataplus._M_p,1,__val);
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_58,0,0,"Have ",5);
    local_98._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == paVar5) {
      local_98.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_98.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_98._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_98.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    local_98._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_98," Dahl");
    local_78._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == paVar5) {
      local_78.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_78.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_78._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_78.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    local_78._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               &local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar3) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_58,1,'-');
    std::__detail::__to_chars_10_impl<unsigned_int>(local_58._M_dataplus._M_p,1,__val);
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_58,0,0,"Have ",5);
    local_98._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == paVar5) {
      local_98.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_98.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_98._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_98.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    local_98._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_98," Anti-Paralyze");
    local_78._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == paVar5) {
      local_78.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_78.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_78._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_78.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    local_78._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               &local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar3) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_58,1,'-');
    std::__detail::__to_chars_10_impl<unsigned_int>(local_58._M_dataplus._M_p,1,__val);
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_58,0,0,"Have ",5);
    local_98._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == paVar5) {
      local_98.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_98.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_98._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_98.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    local_98._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_98," Restoration");
    local_78._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == paVar5) {
      local_78.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_78.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_78._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_78.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    local_78._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               &local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar3) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_58,1,'-');
    std::__detail::__to_chars_10_impl<unsigned_int>(local_58._M_dataplus._M_p,1,__val);
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_58,0,0,"Have ",5);
    local_98._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == paVar5) {
      local_98.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_98.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_98._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_98.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    local_98._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_98," Statue of Gaia");
    local_78._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == paVar5) {
      local_78.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_78.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_78._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_78.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    local_78._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               &local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar3) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_58,1,'-');
    std::__detail::__to_chars_10_impl<unsigned_int>(local_58._M_dataplus._M_p,1,__val);
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_58,0,0,"Have ",5);
    local_98._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == paVar5) {
      local_98.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_98.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_98._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_98.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    local_98._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_98," Golden Statue");
    local_78._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == paVar5) {
      local_78.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_78.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_78._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_78.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    local_78._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               &local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar3) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    __val = __val + 1;
  } while (__val != 10);
  vectools::shuffle<std::__cxx11::string>(this_00,&local_38->_rng);
  return;
}

Assistant:

void init_consumable_goals()
    {
        _consumable_goals.emplace_back("Have 9 EkeEke");
        for(int i = 6 ; i <= 9 ; ++i)
        {
            _consumable_goals.emplace_back("Have " + std::to_string(i) +" Detox Grass");
            _consumable_goals.emplace_back("Have " + std::to_string(i) +" Dahl");
            _consumable_goals.emplace_back("Have " + std::to_string(i) +" Anti-Paralyze");
            _consumable_goals.emplace_back("Have " + std::to_string(i) +" Restoration");
            _consumable_goals.emplace_back("Have " + std::to_string(i) +" Statue of Gaia");
            _consumable_goals.emplace_back("Have " + std::to_string(i) +" Golden Statue");
        }
        vectools::shuffle(_consumable_goals, _rng);
        // Short Cakes ? Pawn Tickets ?
    }